

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexIntegrityCheckSegment(Fts5Index *p,Fts5StructureSegment *pSeg)

{
  u64 uVar1;
  u16 uVar2;
  int iVar3;
  int iVar4;
  char *zSql;
  u64 uVar5;
  bool bVar6;
  int local_cc;
  int local_b4;
  int local_b0;
  u64 uStack_98;
  int iRowidOff_1;
  i64 iRowid;
  i64 iKey;
  int local_80;
  int iPg;
  int iSegid;
  int iPrevLeaf;
  Fts5DlidxIter *pDlidx;
  int res;
  int nTerm;
  int iRowidOff;
  int iOff;
  int bIdxDlidx;
  int iIdxLeaf;
  char *zIdxTerm;
  Fts5Data *pFStack_48;
  int nIdxTerm;
  Fts5Data *pLeaf;
  i64 iRow;
  int local_30;
  int iDlidxPrevLeaf;
  int iIdxPrevLeaf;
  int rc2;
  sqlite3_stmt *pStmt;
  Fts5Config *pConfig;
  Fts5StructureSegment *pSeg_local;
  Fts5Index *p_local;
  
  pStmt = (sqlite3_stmt *)p->pConfig;
  _iIdxPrevLeaf = (sqlite3_stmt *)0x0;
  local_30 = pSeg->pgnoFirst + -1;
  iRow._4_4_ = pSeg->pgnoLast;
  if (pSeg->pgnoFirst != 0) {
    pConfig = (Fts5Config *)pSeg;
    pSeg_local = (Fts5StructureSegment *)p;
    zSql = sqlite3_mprintf("SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                           ,((Fts5Config *)pStmt)->zDb,((Fts5Config *)pStmt)->zName,
                           (ulong)(uint)pSeg->iSegid);
    fts5IndexPrepareStmt(p,(sqlite3_stmt **)&iIdxPrevLeaf,zSql);
    while( true ) {
      do {
        bVar6 = false;
        if (pSeg_local[4].pgnoFirst == 0) {
          iVar3 = sqlite3_step(_iIdxPrevLeaf);
          bVar6 = iVar3 == 100;
        }
        if (!bVar6) goto LAB_00208fe1;
        zIdxTerm._4_4_ = sqlite3_column_bytes(_iIdxPrevLeaf,1);
        _bIdxDlidx = sqlite3_column_text(_iIdxPrevLeaf,1);
        iOff = sqlite3_column_int(_iIdxPrevLeaf,2);
        iRowidOff = sqlite3_column_int(_iIdxPrevLeaf,3);
      } while (iOff < *(int *)((long)&pConfig->db + 4));
      pLeaf = (Fts5Data *)(((long)*(int *)&pConfig->db << 0x25) + (long)iOff);
      pFStack_48 = fts5LeafRead((Fts5Index *)pSeg_local,(i64)pLeaf);
      if (pFStack_48 == (Fts5Data *)0x0) break;
      if (pFStack_48->szLeaf < pFStack_48->nn) {
        nTerm = fts5LeafFirstTermOff(pFStack_48);
        uVar2 = fts5GetU16(pFStack_48->p);
        res = (int)uVar2;
        if ((res < nTerm) && (nTerm < pFStack_48->szLeaf)) {
          iVar3 = sqlite3Fts5GetVarint32(pFStack_48->p + nTerm,(u32 *)((long)&pDlidx + 4));
          nTerm = iVar3 + nTerm;
          if (pDlidx._4_4_ < zIdxTerm._4_4_) {
            local_b0 = pDlidx._4_4_;
          }
          else {
            local_b0 = zIdxTerm._4_4_;
          }
          if (local_b0 == 0) {
            local_b4 = 0;
          }
          else {
            if (pDlidx._4_4_ < zIdxTerm._4_4_) {
              local_cc = pDlidx._4_4_;
            }
            else {
              local_cc = zIdxTerm._4_4_;
            }
            local_b4 = memcmp(pFStack_48->p + nTerm,_bIdxDlidx,(long)local_cc);
          }
          pDlidx._0_4_ = local_b4;
          if (local_b4 == 0) {
            pDlidx._0_4_ = pDlidx._4_4_ - zIdxTerm._4_4_;
          }
          if ((int)pDlidx < 0) {
            pSeg_local[4].pgnoFirst = 0x10b;
          }
        }
        else {
          pSeg_local[4].pgnoFirst = 0x10b;
        }
        fts5IntegrityCheckPgidx((Fts5Index *)pSeg_local,pFStack_48);
      }
      else {
        pSeg_local[4].pgnoFirst = 0x10b;
      }
      fts5DataRelease(pFStack_48);
      if ((pSeg_local[4].pgnoFirst != 0) ||
         (fts5IndexIntegrityCheckEmpty
                    ((Fts5Index *)pSeg_local,(Fts5StructureSegment *)pConfig,local_30 + 1,
                     iRow._4_4_ + 1,iOff + -1), pSeg_local[4].pgnoFirst != 0)) break;
      if (iRowidOff == 0) {
        iRow._4_4_ = *(int *)&pConfig->zDb;
      }
      else {
        _iSegid = (Fts5DlidxIter *)0x0;
        iPg = iOff;
        local_80 = *(int *)&pConfig->db;
        iKey._4_4_ = 0;
        _iSegid = fts5DlidxIterInit((Fts5Index *)pSeg_local,0,local_80,iOff);
        while (iVar4 = fts5DlidxIterEof((Fts5Index *)pSeg_local,_iSegid), iVar3 = iPg, iVar4 == 0) {
          while( true ) {
            iKey._4_4_ = iVar3 + 1;
            iVar3 = iKey._4_4_;
            iVar4 = fts5DlidxIterPgno(_iSegid);
            if (iVar4 <= iVar3) break;
            iRowid = ((long)local_80 << 0x25) + (long)iKey._4_4_;
            pFStack_48 = fts5DataRead((Fts5Index *)pSeg_local,iRowid);
            iVar3 = iKey._4_4_;
            if (pFStack_48 != (Fts5Data *)0x0) {
              uVar2 = fts5GetU16(pFStack_48->p);
              if (uVar2 != 0) {
                pSeg_local[4].pgnoFirst = 0x10b;
              }
              fts5DataRelease(pFStack_48);
              iVar3 = iKey._4_4_;
            }
          }
          iPg = fts5DlidxIterPgno(_iSegid);
          iRowid = ((long)local_80 << 0x25) + (long)iPg;
          pFStack_48 = fts5DataRead((Fts5Index *)pSeg_local,iRowid);
          if (pFStack_48 != (Fts5Data *)0x0) {
            uVar2 = fts5GetU16(pFStack_48->p);
            if ((int)(uint)uVar2 < pFStack_48->szLeaf) {
              sqlite3Fts5GetVarint(pFStack_48->p + (int)(uint)uVar2,&stack0xffffffffffffff68);
              uVar1 = uStack_98;
              uVar5 = fts5DlidxIterRowid(_iSegid);
              if (uVar1 != uVar5) {
                pSeg_local[4].pgnoFirst = 0x10b;
              }
            }
            else {
              pSeg_local[4].pgnoFirst = 0x10b;
            }
            fts5DataRelease(pFStack_48);
          }
          fts5DlidxIterNext((Fts5Index *)pSeg_local,_iSegid);
        }
        iRow._4_4_ = iKey._4_4_;
        fts5DlidxIterFree(_iSegid);
      }
      local_30 = iOff;
    }
LAB_00208fe1:
    iVar3 = sqlite3_finalize(_iIdxPrevLeaf);
    if (pSeg_local[4].pgnoFirst == 0) {
      pSeg_local[4].pgnoFirst = iVar3;
    }
  }
  return;
}

Assistant:

static void fts5IndexIntegrityCheckSegment(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5StructureSegment *pSeg      /* Segment to check internal consistency */
){
  Fts5Config *pConfig = p->pConfig;
  sqlite3_stmt *pStmt = 0;
  int rc2;
  int iIdxPrevLeaf = pSeg->pgnoFirst-1;
  int iDlidxPrevLeaf = pSeg->pgnoLast;

  if( pSeg->pgnoFirst==0 ) return;

  fts5IndexPrepareStmt(p, &pStmt, sqlite3_mprintf(
      "SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.'%q_idx' WHERE segid=%d",
      pConfig->zDb, pConfig->zName, pSeg->iSegid
  ));

  /* Iterate through the b-tree hierarchy.  */
  while( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
    i64 iRow;                     /* Rowid for this leaf */
    Fts5Data *pLeaf;              /* Data for this leaf */

    int nIdxTerm = sqlite3_column_bytes(pStmt, 1);
    const char *zIdxTerm = (const char*)sqlite3_column_text(pStmt, 1);
    int iIdxLeaf = sqlite3_column_int(pStmt, 2);
    int bIdxDlidx = sqlite3_column_int(pStmt, 3);

    /* If the leaf in question has already been trimmed from the segment, 
    ** ignore this b-tree entry. Otherwise, load it into memory. */
    if( iIdxLeaf<pSeg->pgnoFirst ) continue;
    iRow = FTS5_SEGMENT_ROWID(pSeg->iSegid, iIdxLeaf);
    pLeaf = fts5LeafRead(p, iRow);
    if( pLeaf==0 ) break;

    /* Check that the leaf contains at least one term, and that it is equal
    ** to or larger than the split-key in zIdxTerm.  Also check that if there
    ** is also a rowid pointer within the leaf page header, it points to a
    ** location before the term.  */
    if( pLeaf->nn<=pLeaf->szLeaf ){
      p->rc = FTS5_CORRUPT;
    }else{
      int iOff;                   /* Offset of first term on leaf */
      int iRowidOff;              /* Offset of first rowid on leaf */
      int nTerm;                  /* Size of term on leaf in bytes */
      int res;                    /* Comparison of term and split-key */

      iOff = fts5LeafFirstTermOff(pLeaf);
      iRowidOff = fts5LeafFirstRowidOff(pLeaf);
      if( iRowidOff>=iOff || iOff>=pLeaf->szLeaf ){
        p->rc = FTS5_CORRUPT;
      }else{
        iOff += fts5GetVarint32(&pLeaf->p[iOff], nTerm);
        res = fts5Memcmp(&pLeaf->p[iOff], zIdxTerm, MIN(nTerm, nIdxTerm));
        if( res==0 ) res = nTerm - nIdxTerm;
        if( res<0 ) p->rc = FTS5_CORRUPT;
      }

      fts5IntegrityCheckPgidx(p, pLeaf);
    }
    fts5DataRelease(pLeaf);
    if( p->rc ) break;

    /* Now check that the iter.nEmpty leaves following the current leaf
    ** (a) exist and (b) contain no terms. */
    fts5IndexIntegrityCheckEmpty(
        p, pSeg, iIdxPrevLeaf+1, iDlidxPrevLeaf+1, iIdxLeaf-1
    );
    if( p->rc ) break;

    /* If there is a doclist-index, check that it looks right. */
    if( bIdxDlidx ){
      Fts5DlidxIter *pDlidx = 0;  /* For iterating through doclist index */
      int iPrevLeaf = iIdxLeaf;
      int iSegid = pSeg->iSegid;
      int iPg = 0;
      i64 iKey;

      for(pDlidx=fts5DlidxIterInit(p, 0, iSegid, iIdxLeaf);
          fts5DlidxIterEof(p, pDlidx)==0;
          fts5DlidxIterNext(p, pDlidx)
      ){

        /* Check any rowid-less pages that occur before the current leaf. */
        for(iPg=iPrevLeaf+1; iPg<fts5DlidxIterPgno(pDlidx); iPg++){
          iKey = FTS5_SEGMENT_ROWID(iSegid, iPg);
          pLeaf = fts5DataRead(p, iKey);
          if( pLeaf ){
            if( fts5LeafFirstRowidOff(pLeaf)!=0 ) p->rc = FTS5_CORRUPT;
            fts5DataRelease(pLeaf);
          }
        }
        iPrevLeaf = fts5DlidxIterPgno(pDlidx);

        /* Check that the leaf page indicated by the iterator really does
        ** contain the rowid suggested by the same. */
        iKey = FTS5_SEGMENT_ROWID(iSegid, iPrevLeaf);
        pLeaf = fts5DataRead(p, iKey);
        if( pLeaf ){
          i64 iRowid;
          int iRowidOff = fts5LeafFirstRowidOff(pLeaf);
          ASSERT_SZLEAF_OK(pLeaf);
          if( iRowidOff>=pLeaf->szLeaf ){
            p->rc = FTS5_CORRUPT;
          }else{
            fts5GetVarint(&pLeaf->p[iRowidOff], (u64*)&iRowid);
            if( iRowid!=fts5DlidxIterRowid(pDlidx) ) p->rc = FTS5_CORRUPT;
          }
          fts5DataRelease(pLeaf);
        }
      }

      iDlidxPrevLeaf = iPg;
      fts5DlidxIterFree(pDlidx);
      fts5TestDlidxReverse(p, iSegid, iIdxLeaf);
    }else{
      iDlidxPrevLeaf = pSeg->pgnoLast;
      /* TODO: Check there is no doclist index */
    }

    iIdxPrevLeaf = iIdxLeaf;
  }

  rc2 = sqlite3_finalize(pStmt);
  if( p->rc==SQLITE_OK ) p->rc = rc2;

  /* Page iter.iLeaf must now be the rightmost leaf-page in the segment */
#if 0
  if( p->rc==SQLITE_OK && iter.iLeaf!=pSeg->pgnoLast ){
    p->rc = FTS5_CORRUPT;
  }
#endif
}